

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraBddCountCubes(DdManager *dd,DdNode *L,DdNode *U,st__table *table,int *pnCubes,
                           int Limit)

{
  int iVar1;
  DdNode *pDVar2;
  int local_128;
  int local_124;
  int local_120;
  int nCubes;
  int Count2;
  int Count1;
  int Count0;
  int index;
  DdNode *r;
  DdNode *Unv;
  DdNode *Lnv;
  DdNode *Uv;
  DdNode *Lv;
  DdNode *sum;
  DdNode *term1;
  DdNode *term0;
  DdNode *x;
  DdNode *Id;
  DdNode *Isub1;
  DdNode *Isub0;
  DdNode *Usuper1;
  DdNode *Lsuper1;
  DdNode *Usuper0;
  DdNode *Lsuper0;
  DdNode *Ud;
  DdNode *Ld;
  DdNode *Usub1;
  DdNode *Lsub1;
  DdNode *Usub0;
  DdNode *Lsub0;
  int local_58;
  int top_u;
  int top_l;
  int v;
  DdNode *zero;
  DdNode *one;
  int *piStack_38;
  int Limit_local;
  int *pnCubes_local;
  st__table *table_local;
  DdNode *U_local;
  DdNode *L_local;
  DdManager *dd_local;
  
  zero = dd->one;
  _top_l = (DdManager *)((ulong)zero ^ 1);
  Count2 = 0;
  nCubes = 0;
  local_120 = 0;
  if ((DdManager *)L == _top_l) {
    *pnCubes = 0;
    dd_local = _top_l;
  }
  else if (U == zero) {
    *pnCubes = 1;
    dd_local = (DdManager *)zero;
  }
  else {
    one._4_4_ = Limit;
    piStack_38 = pnCubes;
    pnCubes_local = (int *)table;
    table_local = (st__table *)U;
    U_local = L;
    L_local = &dd->sentinel;
    _Count0 = (DdManager *)cuddCacheLookup2(dd,cuddBddIsop,L,U);
    if (_Count0 == (DdManager *)0x0) {
      local_58 = *(int *)(L_local[7].Id + (ulong)*(uint *)((ulong)U_local & 0xfffffffffffffffe) * 4)
      ;
      Lsub0._4_4_ = *(int *)(L_local[7].Id +
                            (ulong)*(uint *)((ulong)table_local & 0xfffffffffffffffe) * 4);
      local_128 = local_58;
      if (Lsub0._4_4_ < local_58) {
        local_128 = Lsub0._4_4_;
      }
      top_u = local_128;
      if (local_58 == local_128) {
        Count1 = *(int *)((ulong)U_local & 0xfffffffffffffffe);
        Uv = *(DdNode **)(((ulong)U_local & 0xfffffffffffffffe) + 0x10);
        Unv = *(DdNode **)(((ulong)U_local & 0xfffffffffffffffe) + 0x18);
        if (((ulong)U_local & 1) != 0) {
          Uv = (DdNode *)((ulong)Uv ^ 1);
          Unv = (DdNode *)((ulong)Unv ^ 1);
        }
      }
      else {
        Count1 = *(int *)((ulong)table_local & 0xfffffffffffffffe);
        Unv = U_local;
        Uv = U_local;
      }
      if (Lsub0._4_4_ == local_128) {
        Lnv = *(DdNode **)(((ulong)table_local & 0xfffffffffffffffe) + 0x10);
        r = *(DdNode **)(((ulong)table_local & 0xfffffffffffffffe) + 0x18);
        if (((ulong)table_local & 1) != 0) {
          Lnv = (DdNode *)((ulong)Lnv ^ 1);
          r = (DdNode *)((ulong)r ^ 1);
        }
      }
      else {
        r = (DdNode *)table_local;
        Lnv = (DdNode *)table_local;
      }
      Usub0 = cuddBddAndRecur((DdManager *)L_local,Unv,(DdNode *)((ulong)Lnv ^ 1));
      if (Usub0 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        Cudd_Ref(Usub0);
        Lsub1 = r;
        Usub1 = cuddBddAndRecur((DdManager *)L_local,Uv,(DdNode *)((ulong)r ^ 1));
        if (Usub1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
          dd_local = (DdManager *)0x0;
        }
        else {
          Cudd_Ref(Usub1);
          Ld = Lnv;
          Isub1 = extraBddCountCubes((DdManager *)L_local,Usub0,Lsub1,(st__table *)pnCubes_local,
                                     &Count2,one._4_4_);
          if (Isub1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
            Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
            dd_local = (DdManager *)0x0;
          }
          else {
            Cudd_Ref(Isub1);
            Id = extraBddCountCubes((DdManager *)L_local,Usub1,Ld,(st__table *)pnCubes_local,&nCubes
                                    ,one._4_4_);
            if (Id == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
              Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
              Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
              dd_local = (DdManager *)0x0;
            }
            else {
              Cudd_Ref(Id);
              Cudd_RecursiveDeref((DdManager *)L_local,Usub0);
              Cudd_RecursiveDeref((DdManager *)L_local,Usub1);
              Usuper0 = cuddBddAndRecur((DdManager *)L_local,Unv,(DdNode *)((ulong)Isub1 ^ 1));
              if (Usuper0 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                Cudd_RecursiveDeref((DdManager *)L_local,Id);
                dd_local = (DdManager *)0x0;
              }
              else {
                Cudd_Ref(Usuper0);
                Usuper1 = cuddBddAndRecur((DdManager *)L_local,Uv,(DdNode *)((ulong)Id ^ 1));
                if (Usuper1 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                  Cudd_RecursiveDeref((DdManager *)L_local,Id);
                  Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  Cudd_Ref(Usuper1);
                  Lsuper1 = r;
                  Isub0 = Lnv;
                  pDVar2 = cuddBddAndRecur((DdManager *)L_local,(DdNode *)((ulong)Usuper0 ^ 1),
                                           (DdNode *)((ulong)Usuper1 ^ 1));
                  Ud = (DdNode *)((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
                  if (Ud == (DdNode *)0x0) {
                    Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                    Cudd_RecursiveDeref((DdManager *)L_local,Id);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                    Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    Cudd_Ref(Ud);
                    Lsuper0 = cuddBddAndRecur((DdManager *)L_local,Lsuper1,Isub0);
                    if (Lsuper0 == (DdNode *)0x0) {
                      Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                      Cudd_RecursiveDeref((DdManager *)L_local,Id);
                      Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                      Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                      Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                      dd_local = (DdManager *)0x0;
                    }
                    else {
                      Cudd_Ref(Lsuper0);
                      Cudd_RecursiveDeref((DdManager *)L_local,Usuper0);
                      Cudd_RecursiveDeref((DdManager *)L_local,Usuper1);
                      x = extraBddCountCubes((DdManager *)L_local,Ud,Lsuper0,
                                             (st__table *)pnCubes_local,&local_120,one._4_4_);
                      if (x == (DdNode *)0x0) {
                        Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                        Cudd_RecursiveDeref((DdManager *)L_local,Id);
                        Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                        Cudd_RecursiveDeref((DdManager *)L_local,Lsuper0);
                        dd_local = (DdManager *)0x0;
                      }
                      else {
                        Cudd_Ref(x);
                        Cudd_RecursiveDeref((DdManager *)L_local,Ud);
                        Cudd_RecursiveDeref((DdManager *)L_local,Lsuper0);
                        term0 = cuddUniqueInter((DdManager *)L_local,Count1,zero,&_top_l->sentinel);
                        if (term0 == (DdNode *)0x0) {
                          Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                          Cudd_RecursiveDeref((DdManager *)L_local,Id);
                          Cudd_RecursiveDeref((DdManager *)L_local,x);
                          dd_local = (DdManager *)0x0;
                        }
                        else {
                          Cudd_Ref(term0);
                          term1 = cuddBddAndRecur((DdManager *)L_local,(DdNode *)((ulong)term0 ^ 1),
                                                  Isub1);
                          if (term1 == (DdNode *)0x0) {
                            Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                            Cudd_RecursiveDeref((DdManager *)L_local,Id);
                            Cudd_RecursiveDeref((DdManager *)L_local,x);
                            Cudd_RecursiveDeref((DdManager *)L_local,term0);
                            dd_local = (DdManager *)0x0;
                          }
                          else {
                            Cudd_Ref(term1);
                            Cudd_RecursiveDeref((DdManager *)L_local,Isub1);
                            sum = cuddBddAndRecur((DdManager *)L_local,term0,Id);
                            if (sum == (DdNode *)0x0) {
                              Cudd_RecursiveDeref((DdManager *)L_local,Id);
                              Cudd_RecursiveDeref((DdManager *)L_local,x);
                              Cudd_RecursiveDeref((DdManager *)L_local,term0);
                              Cudd_RecursiveDeref((DdManager *)L_local,term1);
                              dd_local = (DdManager *)0x0;
                            }
                            else {
                              Cudd_Ref(sum);
                              Cudd_RecursiveDeref((DdManager *)L_local,term0);
                              Cudd_RecursiveDeref((DdManager *)L_local,Id);
                              pDVar2 = cuddBddAndRecur((DdManager *)L_local,
                                                       (DdNode *)((ulong)term1 ^ 1),
                                                       (DdNode *)((ulong)sum ^ 1));
                              Lv = (DdNode *)
                                   ((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
                              if (Lv == (DdNode *)0x0) {
                                Cudd_RecursiveDeref((DdManager *)L_local,x);
                                Cudd_RecursiveDeref((DdManager *)L_local,term1);
                                Cudd_RecursiveDeref((DdManager *)L_local,sum);
                                dd_local = (DdManager *)0x0;
                              }
                              else {
                                Cudd_Ref(Lv);
                                Cudd_RecursiveDeref((DdManager *)L_local,term1);
                                Cudd_RecursiveDeref((DdManager *)L_local,sum);
                                pDVar2 = cuddBddAndRecur((DdManager *)L_local,
                                                         (DdNode *)((ulong)Lv ^ 1),
                                                         (DdNode *)((ulong)x ^ 1));
                                _Count0 = (DdManager *)
                                          ((ulong)pDVar2 ^
                                          (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
                                if (_Count0 == (DdManager *)0x0) {
                                  Cudd_RecursiveDeref((DdManager *)L_local,x);
                                  Cudd_RecursiveDeref((DdManager *)L_local,Lv);
                                  dd_local = (DdManager *)0x0;
                                }
                                else {
                                  Cudd_Ref((DdNode *)_Count0);
                                  Cudd_RecursiveDeref((DdManager *)L_local,Lv);
                                  Cudd_RecursiveDeref((DdManager *)L_local,x);
                                  cuddCacheInsert2((DdManager *)L_local,cuddBddIsop,U_local,
                                                   (DdNode *)table_local,&_Count0->sentinel);
                                  *piStack_38 = Count2 + nCubes + local_120;
                                  iVar1 = st__add_direct((st__table *)pnCubes_local,(char *)_Count0,
                                                         (char *)(long)*piStack_38);
                                  if (iVar1 == -10000) {
                                    Cudd_RecursiveDeref((DdManager *)L_local,&_Count0->sentinel);
                                    dd_local = (DdManager *)0x0;
                                  }
                                  else if (one._4_4_ < *piStack_38) {
                                    Cudd_RecursiveDeref((DdManager *)L_local,&_Count0->sentinel);
                                    dd_local = (DdManager *)0x0;
                                  }
                                  else {
                                    Cudd_Deref(&_Count0->sentinel);
                                    dd_local = _Count0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_124 = 0;
      iVar1 = st__lookup((st__table *)pnCubes_local,(char *)_Count0,(char **)&local_124);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                      ,0x510,
                      "DdNode *extraBddCountCubes(DdManager *, DdNode *, DdNode *, st__table *, int *, int)"
                     );
      }
      *piStack_38 = local_124;
      dd_local = _Count0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode * extraBddCountCubes( DdManager * dd, DdNode * L, DdNode * U, st__table *table, int * pnCubes, int Limit )
{
    DdNode      *one = DD_ONE(dd);
    DdNode      *zero = Cudd_Not(one);
    int         v, top_l, top_u;
    DdNode      *Lsub0, *Usub0, *Lsub1, *Usub1, *Ld, *Ud;
    DdNode      *Lsuper0, *Usuper0, *Lsuper1, *Usuper1;
    DdNode      *Isub0, *Isub1, *Id;
    DdNode      *x;
    DdNode      *term0, *term1, *sum;
    DdNode      *Lv, *Uv, *Lnv, *Unv;
    DdNode      *r;
    int         index;
    int         Count0 = 0, Count1 = 0, Count2 = 0;

    statLine(dd);
    if (L == zero)
    {
        *pnCubes = 0;
        return(zero);
    }
    if (U == one)
    {
        *pnCubes = 1;
        return(one);
    }

    /* Check cache */
    r = cuddCacheLookup2(dd, cuddBddIsop, L, U);
    if (r)
    {
        int nCubes = 0;
        if ( st__lookup( table, (char *)r, (char **)&nCubes ) )
            *pnCubes = nCubes;
        else assert( 0 );
        return r;
    }

    top_l = dd->perm[Cudd_Regular(L)->index];
    top_u = dd->perm[Cudd_Regular(U)->index];
    v = ddMin(top_l, top_u);

    /* Compute cofactors */
    if (top_l == v) {
        index = Cudd_Regular(L)->index;
        Lv = Cudd_T(L);
        Lnv = Cudd_E(L);
        if (Cudd_IsComplement(L)) {
            Lv = Cudd_Not(Lv);
            Lnv = Cudd_Not(Lnv);
        }
    }
    else {
        index = Cudd_Regular(U)->index;
        Lv = Lnv = L;
    }

    if (top_u == v) {
        Uv = Cudd_T(U);
        Unv = Cudd_E(U);
        if (Cudd_IsComplement(U)) {
            Uv = Cudd_Not(Uv);
            Unv = Cudd_Not(Unv);
        }
    }
    else {
        Uv = Unv = U;
    }

    Lsub0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Uv));
    if (Lsub0 == NULL)
        return(NULL);
    Cudd_Ref(Lsub0);
    Usub0 = Unv;
    Lsub1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Unv));
    if (Lsub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        return(NULL);
    }
    Cudd_Ref(Lsub1);
    Usub1 = Uv;

    Isub0 = extraBddCountCubes(dd, Lsub0, Usub0, table, &Count0, Limit);
    if (Isub0 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        return(NULL);
    }
    Cudd_Ref(Isub0);
    Isub1 = extraBddCountCubes(dd, Lsub1, Usub1, table, &Count1, Limit);
    if (Isub1 == NULL) {
        Cudd_RecursiveDeref(dd, Lsub0);
        Cudd_RecursiveDeref(dd, Lsub1);
        Cudd_RecursiveDeref(dd, Isub0);
        return(NULL);
    }
    Cudd_Ref(Isub1);
    Cudd_RecursiveDeref(dd, Lsub0);
    Cudd_RecursiveDeref(dd, Lsub1);

    Lsuper0 = cuddBddAndRecur(dd, Lnv, Cudd_Not(Isub0));
    if (Lsuper0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        return(NULL);
    }
    Cudd_Ref(Lsuper0);
    Lsuper1 = cuddBddAndRecur(dd, Lv, Cudd_Not(Isub1));
    if (Lsuper1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        return(NULL);
    }
    Cudd_Ref(Lsuper1);
    Usuper0 = Unv;
    Usuper1 = Uv;

    /* Ld = Lsuper0 + Lsuper1 */
    Ld = cuddBddAndRecur(dd, Cudd_Not(Lsuper0), Cudd_Not(Lsuper1));
    Ld = Cudd_NotCond(Ld, Ld != NULL);
    if (Ld == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        return(NULL);
    }
    Cudd_Ref(Ld);
    Ud = cuddBddAndRecur(dd, Usuper0, Usuper1);
    if (Ud == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Lsuper0);
        Cudd_RecursiveDeref(dd, Lsuper1);
        Cudd_RecursiveDeref(dd, Ld);
        return(NULL);
    }
    Cudd_Ref(Ud);
    Cudd_RecursiveDeref(dd, Lsuper0);
    Cudd_RecursiveDeref(dd, Lsuper1);

    Id = extraBddCountCubes(dd, Ld, Ud, table, &Count2, Limit);
    if (Id == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Ld);
        Cudd_RecursiveDeref(dd, Ud);
        return(NULL);
    }
    Cudd_Ref(Id);
    Cudd_RecursiveDeref(dd, Ld);
    Cudd_RecursiveDeref(dd, Ud);

    x = cuddUniqueInter(dd, index, one, zero);
    if (x == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        return(NULL);
    }
    Cudd_Ref(x);
    term0 = cuddBddAndRecur(dd, Cudd_Not(x), Isub0);
    if (term0 == NULL) {
        Cudd_RecursiveDeref(dd, Isub0);
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        return(NULL);
    }
    Cudd_Ref(term0);
    Cudd_RecursiveDeref(dd, Isub0);
    term1 = cuddBddAndRecur(dd, x, Isub1);
    if (term1 == NULL) {
        Cudd_RecursiveDeref(dd, Isub1);
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, x);
        Cudd_RecursiveDeref(dd, term0);
        return(NULL);
    }
    Cudd_Ref(term1);
    Cudd_RecursiveDeref(dd, x);
    Cudd_RecursiveDeref(dd, Isub1);
    /* sum = term0 + term1 */
    sum = cuddBddAndRecur(dd, Cudd_Not(term0), Cudd_Not(term1));
    sum = Cudd_NotCond(sum, sum != NULL);
    if (sum == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, term0);
        Cudd_RecursiveDeref(dd, term1);
        return(NULL);
    }
    Cudd_Ref(sum);
    Cudd_RecursiveDeref(dd, term0);
    Cudd_RecursiveDeref(dd, term1);
    /* r = sum + Id */
    r = cuddBddAndRecur(dd, Cudd_Not(sum), Cudd_Not(Id));
    r = Cudd_NotCond(r, r != NULL);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, Id);
        Cudd_RecursiveDeref(dd, sum);
        return(NULL);
    }
    Cudd_Ref(r);
    Cudd_RecursiveDeref(dd, sum);
    Cudd_RecursiveDeref(dd, Id);

    cuddCacheInsert2(dd, cuddBddIsop, L, U, r);
    *pnCubes = Count0 + Count1 + Count2;
    if ( st__add_direct( table, (char *)r, (char *)(ABC_PTRINT_T)*pnCubes ) == st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( dd, r );
        return NULL;
    }
    if ( *pnCubes > Limit )
    {
        Cudd_RecursiveDeref( dd, r );
        return NULL;
    }
    //printf( "%d ", *pnCubes );
    Cudd_Deref(r);
    return r;
}